

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdGequald(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86XmmReg reg1;
  x86XmmReg reg1_00;
  x86XmmReg rhs;
  x86XmmReg lhs;
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  reg1 = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
  ctx_local._2_1_ = cmd.rB;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,reg1,sQWORD,rEBX,(uint)ctx_local._2_1_ << 3);
  ctx_local._3_1_ = cmd.rC;
  ctx_local._4_4_ = cmd.argument;
  reg1_00 = GenCodeLoadDoubleFromPointerIntoRegister(ctx,rEAX,ctx_local._3_1_,ctx_local._4_4_);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_OP_REG_REG(&ctx->ctx,o_cmplesd,reg1_00,reg1);
  EMIT_OP_REG_REG(&ctx->ctx,o_movd,rEAX,reg1_00);
  EMIT_OP_REG_NUM(&ctx->ctx,o_and,rEAX,1);
  ctx_local._1_1_ = cmd.rA;
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,(uint)ctx_local._1_1_ << 3,rEAX);
  return;
}

Assistant:

void GenCodeCmdGequald(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	x86XmmReg lhs = ctx.ctx.GetXmmReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, lhs, sQWORD, rREG, cmd.rB * 8); // Load double value

	x86XmmReg rhs = GenCodeLoadDoubleFromPointerIntoRegister(ctx, rRAX, cmd.rC, cmd.argument);

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG_REG(ctx.ctx, o_cmplesd, rhs, lhs);
	EMIT_OP_REG_REG(ctx.ctx, o_movd, rEAX, rhs);
	EMIT_OP_REG_NUM(ctx.ctx, o_and, rEAX, 0x01);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Store int to target
}